

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece.pb.cc
# Opt level: O0

uint8 * __thiscall
sentencepiece::SentencePieceText::_InternalSerialize
          (SentencePieceText *this,uint8 *target,EpsCopyOutputStream *stream)

{
  uint uVar1;
  uint32 uVar2;
  SentencePieceText_SentencePiece *target_00;
  uint8 *puVar3;
  EpsCopyOutputStream *in_RDX;
  EpsCopyOutputStream *in_RSI;
  SentencePieceText *in_RDI;
  uint n;
  uint i;
  uint32 cached_has_bits;
  SentencePieceText *in_stack_fffffffffffffeb8;
  SentencePieceText *in_stack_fffffffffffffec0;
  InternalMetadata *this_00;
  EpsCopyOutputStream *in_stack_fffffffffffffec8;
  int size;
  InternalMetadata *this_01;
  EpsCopyOutputStream *in_stack_fffffffffffffed8;
  uint32 in_stack_fffffffffffffeec;
  undefined4 in_stack_fffffffffffffef0;
  uint uVar4;
  uint uVar5;
  EpsCopyOutputStream *target_01;
  SentencePieceText_SentencePiece *this_02;
  SentencePieceText *target_02;
  int in_stack_ffffffffffffff10;
  int start_field_number;
  ExtensionSet *this_03;
  
  this_03 = (ExtensionSet *)&in_RDI->_has_bits_;
  start_field_number = 0;
  uVar5 = ((HasBits<1UL> *)this_03)->has_bits_[0];
  target_01 = in_RDX;
  target_02 = in_RDI;
  if ((uVar5 & 1) != 0) {
    _internal_text_abi_cxx11_(in_stack_fffffffffffffeb8);
    in_RSI = (EpsCopyOutputStream *)
             google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                       ((EpsCopyOutputStream *)CONCAT44(uVar5,in_stack_fffffffffffffef0),
                        in_stack_fffffffffffffeec,(string *)in_RDI,(uint8 *)in_RDX);
    in_stack_fffffffffffffed8 = in_RDX;
  }
  uVar4 = 0;
  uVar1 = _internal_pieces_size((SentencePieceText *)0x44f588);
  for (; uVar4 < uVar1; uVar4 = uVar4 + 1) {
    target_00 = (SentencePieceText_SentencePiece *)
                google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                          (in_stack_fffffffffffffec8,(uint8 *)in_stack_fffffffffffffec0);
    _internal_pieces(in_stack_fffffffffffffec0,(int)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
    this_02 = target_00;
    uVar2 = google::protobuf::internal::WireFormatLite::MakeTag(2,WIRETYPE_LENGTH_DELIMITED);
    puVar3 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArray(uVar2,(uint8 *)target_00)
    ;
    uVar2 = SentencePieceText_SentencePiece::GetCachedSize
                      ((SentencePieceText_SentencePiece *)0x44f66a);
    google::protobuf::io::CodedOutputStream::WriteVarint32ToArray(uVar2,puVar3);
    in_RSI = (EpsCopyOutputStream *)
             SentencePieceText_SentencePiece::_InternalSerialize
                       (this_02,(uint8 *)target_01,(EpsCopyOutputStream *)CONCAT44(uVar5,uVar4));
  }
  if ((uVar5 & 2) != 0) {
    puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                       (in_stack_fffffffffffffec8,(uint8 *)in_stack_fffffffffffffec0);
    _internal_score(in_RDI);
    uVar2 = google::protobuf::internal::WireFormatLite::MakeTag(3,WIRETYPE_FIXED32);
    puVar3 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArray(uVar2,puVar3);
    uVar2 = google::protobuf::internal::WireFormatLite::EncodeFloat(0.0);
    in_RSI = (EpsCopyOutputStream *)
             google::protobuf::io::CodedOutputStream::WriteLittleEndian32ToArray(uVar2,puVar3);
  }
  size = (int)((ulong)target_01 >> 0x20);
  puVar3 = google::protobuf::internal::ExtensionSet::_InternalSerialize
                     (this_03,start_field_number,in_stack_ffffffffffffff10,(uint8 *)target_02,in_RSI
                     );
  if (((uint)(in_RDI->super_MessageLite)._internal_metadata_.ptr_ & 1) == 1) {
    this_01 = &(in_RDI->super_MessageLite)._internal_metadata_;
    if (((uint)this_01->ptr_ & 1) == 1) {
      google::protobuf::internal::InternalMetadata::
      PtrValue<google::protobuf::internal::InternalMetadata::Container<std::__cxx11::string>>
                (this_01);
    }
    else {
      google::protobuf::internal::GetEmptyString_abi_cxx11_();
    }
    std::__cxx11::string::data();
    this_00 = &(in_RDI->super_MessageLite)._internal_metadata_;
    if (((uint)this_00->ptr_ & 1) == 1) {
      google::protobuf::internal::InternalMetadata::
      PtrValue<google::protobuf::internal::InternalMetadata::Container<std::__cxx11::string>>
                (this_00);
    }
    else {
      google::protobuf::internal::GetEmptyString_abi_cxx11_();
    }
    std::__cxx11::string::size();
    puVar3 = google::protobuf::io::EpsCopyOutputStream::WriteRaw
                       (in_stack_fffffffffffffed8,this_01,size,(uint8 *)this_00);
  }
  return puVar3;
}

Assistant:

::PROTOBUF_NAMESPACE_ID::uint8* SentencePieceText::_InternalSerialize(
    ::PROTOBUF_NAMESPACE_ID::uint8* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:sentencepiece.SentencePieceText)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional string text = 1;
  if (cached_has_bits & 0x00000001u) {
    target = stream->WriteStringMaybeAliased(
        1, this->_internal_text(), target);
  }

  // repeated .sentencepiece.SentencePieceText.SentencePiece pieces = 2;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_pieces_size()); i < n; i++) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(2, this->_internal_pieces(i), target, stream);
  }

  // optional float score = 3;
  if (cached_has_bits & 0x00000002u) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteFloatToArray(3, this->_internal_score(), target);
  }

  // Extension range [200, 536870912)
  target = _extensions_._InternalSerialize(
      200, 536870912, target, stream);

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:sentencepiece.SentencePieceText)
  return target;
}